

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O1

int find_paren(char **string)

{
  byte bVar1;
  int iVar2;
  char *tstr;
  byte *local_28;
  
  local_28 = (byte *)*string;
  do {
    while (bVar1 = *local_28, 0x5a < bVar1) {
      if (bVar1 == 0x5b) {
        local_28 = local_28 + 1;
        iVar2 = find_bracket((char **)&local_28);
      }
      else {
        if (bVar1 != 0x7b) goto switchD_0012d869_caseD_23;
        local_28 = local_28 + 1;
        iVar2 = find_curlybracket((char **)&local_28);
      }
LAB_0012d8e6:
      if (iVar2 != 0) {
        return 1;
      }
    }
    switch(bVar1) {
    case 0x22:
      local_28 = local_28 + 2;
      while( true ) {
        if (local_28[-1] == 0) {
          return 1;
        }
        if (local_28[-1] == 0x22) break;
        local_28 = local_28 + 1;
      }
      break;
    case 0x27:
      local_28 = local_28 + 2;
      while( true ) {
        if (local_28[-1] == 0) {
          return 1;
        }
        if (local_28[-1] == 0x27) break;
        local_28 = local_28 + 1;
      }
      break;
    case 0x28:
      local_28 = local_28 + 1;
      iVar2 = find_paren((char **)&local_28);
      goto LAB_0012d8e6;
    case 0x29:
      *string = (char *)(local_28 + 1);
      return 0;
    default:
      if (bVar1 == 0) {
        return 1;
      }
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
switchD_0012d869_caseD_23:
      local_28 = local_28 + 1;
    }
  } while( true );
}

Assistant:

static int find_paren(char **string)

/*  
    look for the closing parenthesis character in the input string
*/
{
    char *tstr;

    tstr = *string;

    while (*tstr) {

        if (*tstr == ')') { /* found the closing parens */
           *string = tstr + 1;  /* set pointer to next char */
           return(0); 
        } else if (*tstr == '(') { /* found another level of parens */
           tstr++;
           if (find_paren(&tstr)) return(1); 
        } else if (*tstr == '[') { 
           tstr++;
           if (find_bracket(&tstr)) return(1);
        } else if (*tstr == '{') { 
           tstr++;
           if (find_curlybracket(&tstr)) return(1);
        } else if (*tstr == '"') { 
           tstr++;
           if (find_doublequote(&tstr)) return(1);
        } else if (*tstr == '\'') { 
           tstr++;
           if (find_quote(&tstr)) return(1);
        } else { 
           tstr++;
        }
    }
    return(1);  /* opps, didn't find the closing character */
}